

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.h
# Opt level: O1

int __thiscall jaegertracing::net::Socket::open(Socket *this,char *__file,int __oflag,...)

{
  int iVar1;
  ostream *this_00;
  system_error *this_01;
  int *piVar2;
  error_category *__ecat;
  int __domain;
  ostringstream oss;
  string sStack_1b8;
  ostringstream local_198 [376];
  
  __domain = (int)__file;
  iVar1 = socket(__domain,__oflag,0);
  if (-1 < iVar1) {
    this->_handle = iVar1;
    this->_family = __domain;
    this->_type = __oflag;
    return iVar1;
  }
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"Failed to open socket, family=",0x1e);
  this_00 = (ostream *)std::ostream::operator<<((ostream *)local_198,__domain);
  std::__ostream_insert<char,std::char_traits<char>>(this_00,", type=",7);
  std::ostream::operator<<((ostream *)this_00,__oflag);
  this_01 = (system_error *)__cxa_allocate_exception(0x20);
  piVar2 = __errno_location();
  iVar1 = *piVar2;
  std::__cxx11::stringbuf::str();
  __ecat = (error_category *)std::_V2::system_category();
  std::system_error::system_error(this_01,iVar1,__ecat,&sStack_1b8);
  __cxa_throw(this_01,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

void open(int family, int type)
    {
        const auto handle = ::socket(family, type, 0);
        if (isHandleInvalid(handle)) {
            std::ostringstream oss;
            oss << "Failed to open socket"
                   ", family="
                << family << ", type=" << type;
            throw std::system_error(errno, std::system_category(), oss.str());
        }
        _handle = handle;
        _family = family;
        _type = type;
    }